

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

bool __thiscall
google::protobuf::EnumValueDescriptorProto::MergePartialFromCodedStream
          (EnumValueDescriptorProto *this,CodedInputStream *input)

{
  ArenaStringPtr *this_00;
  byte bVar1;
  byte *pbVar2;
  void *pvVar3;
  uint8 *puVar4;
  bool bVar5;
  uint32 uVar6;
  uint uVar7;
  int byte_limit;
  EnumValueOptions *this_01;
  pair<int,_int> pVar8;
  UnknownFieldSet *unknown_fields;
  char cVar9;
  uint tag;
  ulong uVar10;
  string *value;
  
  this_00 = &this->name_;
LAB_0059247f:
  do {
    pbVar2 = input->buffer_;
    uVar6 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar6 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_005924a2;
      input->buffer_ = pbVar2 + 1;
      uVar10 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_005924a2:
      uVar6 = io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar10 = 0;
      if (uVar6 - 1 < 0x7f) {
        uVar10 = 0x100000000;
      }
      uVar10 = uVar6 | uVar10;
    }
    tag = (uint)uVar10;
    if ((uVar10 & 0x100000000) == 0) goto LAB_005924c3;
    uVar7 = (uint)(uVar10 >> 3) & 0x1fffffff;
    cVar9 = (char)uVar10;
    if (uVar7 == 3) {
      if (cVar9 != '\x1a') goto LAB_005924c3;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      this_01 = this->options_;
      if (this_01 == (EnumValueOptions *)0x0) {
        this_01 = (EnumValueOptions *)operator_new(0x70);
        EnumValueOptions::EnumValueOptions(this_01);
        this->options_ = this_01;
      }
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (byte_limit = (int)(char)*puVar4, -1 < byte_limit)) {
        input->buffer_ = puVar4 + 1;
      }
      else {
        byte_limit = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (byte_limit < 0) {
          return false;
        }
      }
      pVar8 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,byte_limit);
      if ((long)pVar8 < 0) {
        return false;
      }
      bVar5 = EnumValueOptions::MergePartialFromCodedStream(this_01,input);
      if (!bVar5) {
        return false;
      }
      bVar5 = io::CodedInputStream::DecrementRecursionDepthAndPopLimit(input,pVar8.first);
    }
    else {
      if (uVar7 == 2) {
        if (cVar9 == '\x10') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
          pbVar2 = input->buffer_;
          if (pbVar2 < input->buffer_end_) {
            bVar1 = *pbVar2;
            uVar10 = (ulong)bVar1;
            uVar6 = (uint32)bVar1;
            if ((char)bVar1 < '\0') goto LAB_00592640;
            input->buffer_ = pbVar2 + 1;
          }
          else {
            uVar6 = 0;
LAB_00592640:
            uVar10 = io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
            if ((long)uVar10 < 0) {
              return false;
            }
          }
          this->number_ = (int32)uVar10;
          goto LAB_0059247f;
        }
      }
      else if ((uVar7 == 1) && (cVar9 == '\n')) {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        value = (this->name_).ptr_;
        if (value == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_00,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
          value = this_00->ptr_;
        }
        bVar5 = internal::WireFormatLite::ReadBytes(input,value);
        if (!bVar5) {
          return false;
        }
        internal::WireFormatLite::VerifyUtf8String
                  ((this_00->ptr_->_M_dataplus)._M_p,(int)this_00->ptr_->_M_string_length,PARSE,
                   "google.protobuf.EnumValueDescriptorProto.name");
        goto LAB_0059247f;
      }
LAB_005924c3:
      if (tag == 0) {
        return true;
      }
      if ((tag & 7) == 4) {
        return true;
      }
      pvVar3 = (this->_internal_metadata_).
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               .ptr_;
      if (((ulong)pvVar3 & 1) == 0) {
        unknown_fields =
             internal::
             InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ::mutable_unknown_fields_slow
                       (&(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       );
      }
      else {
        unknown_fields = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
      }
      bVar5 = internal::WireFormat::SkipField(input,tag,unknown_fields);
    }
    if (bVar5 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool EnumValueDescriptorProto::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:google.protobuf.EnumValueDescriptorProto)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.EnumValueDescriptorProto.name");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional int32 number = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          set_has_number();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &number_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .google.protobuf.EnumValueOptions options = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_options()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:google.protobuf.EnumValueDescriptorProto)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:google.protobuf.EnumValueDescriptorProto)
  return false;
#undef DO_
}